

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O0

int lib::io::Write(State *state)

{
  bool bVar1;
  int iVar2;
  ValueT VVar3;
  int iVar4;
  UserData *this;
  FILE *__s;
  String *this_00;
  char *__ptr;
  size_t sVar5;
  State *in_RDI;
  size_t len;
  char *c_str;
  String *str;
  ValueT type;
  int i;
  int params;
  FILE *file;
  UserData *user_data;
  StackAPI api;
  ValueT in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  FILE *in_stack_ffffffffffffffa0;
  StackAPI *in_stack_ffffffffffffffa8;
  int local_38;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>
                    (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (ValueT)in_stack_ffffffffffffffa0);
  if (bVar1) {
    this = luna::StackAPI::GetUserData
                     (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    __s = (FILE *)luna::UserData::GetData(this);
    iVar2 = luna::StackAPI::GetStackSize((StackAPI *)in_stack_ffffffffffffffa0);
    for (local_38 = 1; local_38 < iVar2; local_38 = local_38 + 1) {
      VVar3 = luna::StackAPI::GetValueType
                        (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      if (VVar3 == ValueT_String) {
        this_00 = luna::StackAPI::GetString
                            (in_stack_ffffffffffffffa8,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
        __ptr = luna::String::GetCStr(this_00);
        in_stack_ffffffffffffffa8 = (StackAPI *)luna::String::GetLength(this_00);
        sVar5 = fwrite(__ptr,(size_t)in_stack_ffffffffffffffa8,1,__s);
        if (sVar5 != 1) {
          iVar2 = PushError((StackAPI *)in_stack_ffffffffffffffa0);
          return iVar2;
        }
      }
      else {
        if (VVar3 != ValueT_Number) {
          luna::StackAPI::ArgTypeError
                    ((StackAPI *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                     in_stack_ffffffffffffff98);
          return 0;
        }
        in_stack_ffffffffffffffa0 = __s;
        luna::StackAPI::GetNumber(in_stack_ffffffffffffffa8,(int)((ulong)__s >> 0x20));
        iVar4 = fprintf(in_stack_ffffffffffffffa0,"%.14g");
        if (iVar4 < 0) {
          iVar2 = PushError((StackAPI *)in_stack_ffffffffffffffa0);
          return iVar2;
        }
      }
    }
    luna::StackAPI::PushUserData
              ((StackAPI *)in_stack_ffffffffffffffa0,
               (UserData *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Write(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_UserData))
            return 0;

        auto user_data = api.GetUserData(0);
        auto file = reinterpret_cast<std::FILE *>(user_data->GetData());
        auto params = api.GetStackSize();
        for (int i = 1; i < params; ++i)
        {
            auto type = api.GetValueType(i);
            if (type == luna::ValueT_String)
            {
                auto str = api.GetString(i);
                auto c_str = str->GetCStr();
                auto len = str->GetLength();
                if (std::fwrite(c_str, len, 1, file) != 1)
                    return PushError(api);
            }
            else if (type == luna::ValueT_Number)
            {
                if (std::fprintf(file, "%.14g", api.GetNumber(i)) < 0)
                    return PushError(api);
            }
            else
            {
                api.ArgTypeError(i, luna::ValueT_String);
                return 0;
            }
        }

        api.PushUserData(user_data);
        return 1;
    }